

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  byte *pbVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  int iVar7;
  CURLcode CVar8;
  ulong uVar9;
  size_t sVar10;
  Curl_cwriter *pCVar11;
  ulong uVar12;
  char *pcVar13;
  Curl_cwtype **ppCVar14;
  Curl_cwtype *cwt;
  ulong max;
  byte *pbVar15;
  bool bVar16;
  bool bVar17;
  Curl_cwriter *writer;
  Curl_cwriter *local_50;
  char *local_48;
  ulong local_40;
  char *local_38;
  
  bVar16 = is_transfer == 0;
  local_40 = (ulong)bVar16;
  pcVar13 = "content";
  if (!bVar16) {
    pcVar13 = "transfer";
  }
  local_38 = "chunked";
  local_48 = (char *)0x0;
  bVar3 = false;
  do {
    while ((uVar9 = (ulong)(byte)*enclist, uVar9 < 0x2d &&
           ((0x100100000200U >> (uVar9 & 0x3f) & 1) != 0))) {
      enclist = (char *)((byte *)enclist + 1);
    }
    uVar12 = 1;
    max = 0;
    pbVar15 = (byte *)enclist;
    while ((bVar6 = (byte)uVar9, bVar6 != 0 && ((int)uVar9 != 0x2c))) {
      if (' ' < (char)bVar6) {
        max = uVar12;
      }
      pbVar1 = pbVar15 + 1;
      pbVar15 = pbVar15 + 1;
      uVar12 = uVar12 + 1;
      uVar9 = (ulong)*pbVar1;
    }
    if (max != 0) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < Curl_trc_feat_write.log_level)) {
        Curl_trc_write(data,"looking for %s decoder: %.*s",pcVar13,max & 0xffffffff,enclist);
      }
      if ((is_transfer == 0) || (max != 7)) {
        uVar9 = *(ulong *)&(data->set).field_0x89c;
        if (is_transfer != 0) {
          bVar17 = false;
          goto LAB_0011ce45;
        }
        if ((uVar9 >> 0x25 & 1) == 0) {
          sVar10 = Curl_cwriter_count(data,CURL_CW_CONTENT_DECODE);
          if (sVar10 - 4 < 0xfffffffffffffffb) goto LAB_0011d0f6;
          bVar17 = false;
LAB_0011cf8b:
          ppCVar14 = general_unencoders;
          cwt = &identity_encoding;
          do {
            ppCVar14 = ppCVar14 + 1;
            iVar7 = curl_strnequal(enclist,cwt->name,max);
            if (((iVar7 != 0) && (cwt->name[max] == '\0')) ||
               ((cwt->alias != (char *)0x0 &&
                ((iVar7 = curl_strnequal(enclist,cwt->alias,max), iVar7 != 0 &&
                 (cwt->alias[max] == '\0')))))) goto LAB_0011d009;
            cwt = *ppCVar14;
          } while (cwt != (Curl_cwtype *)0x0);
          cwt = &error_writer;
          goto LAB_0011d02a;
        }
LAB_0011ce57:
        iVar7 = curl_strnequal(enclist,"identity",8);
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ) && (0 < Curl_trc_feat_write.log_level)))) {
          Curl_trc_write(data,"decoder not requested, ignored: %.*s",max & 0xffffffff,enclist);
        }
        if (is_transfer == 0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x8a0 & 0x10) != 0) {
          return CURLE_OK;
        }
        if (bVar3) {
          pcVar13 = "A Transfer-Encoding (%.*s) was listed after chunked";
LAB_0011d139:
          Curl_failf(data,pcVar13,max & 0xffffffff,enclist);
          return CURLE_BAD_CONTENT_ENCODING;
        }
        if (iVar7 == 0) {
          pcVar13 = "Unsolicited Transfer-Encoding (%.*s) found";
          goto LAB_0011d139;
        }
        bVar3 = false;
      }
      else {
        iVar7 = curl_strnequal(enclist,"chunked",7);
        bVar17 = iVar7 != 0;
        uVar9 = *(ulong *)&(data->set).field_0x89c;
LAB_0011ce45:
        if ((((uint)uVar9 >> 0x18 & 1) == 0) && (!bVar17)) goto LAB_0011ce57;
        sVar10 = Curl_cwriter_count(data,CURL_CW_TRANSFER_DECODE);
        pcVar5 = local_38;
        if (sVar10 - 4 < 0xfffffffffffffffb) {
LAB_0011d0f6:
          Curl_failf(data,"Reject response due to more than %u content encodings",5);
          return CURLE_BAD_CONTENT_ENCODING;
        }
        iVar7 = curl_strnequal(enclist,local_38,max);
        pcVar4 = local_48;
        if ((iVar7 == 0) || (pcVar5[max] != '\0')) {
          if ((local_48 == (char *)0x0) ||
             ((iVar7 = curl_strnequal(enclist,local_48,max), iVar7 == 0 ||
              (cwt = &Curl_httpchunk_unencoder, pcVar4[max] != '\0')))) goto LAB_0011cf8b;
        }
        else {
          cwt = &Curl_httpchunk_unencoder;
        }
LAB_0011d009:
        if (bVar17) {
          pCVar11 = Curl_cwriter_get_by_type(data,cwt);
          bVar17 = true;
          if (pCVar11 != (Curl_cwriter *)0x0) {
            if (data == (Curl_easy *)0x0) {
              return CURLE_OK;
            }
            if (((data->set).field_0x89f & 0x40) != 0) {
              pcVar2 = (data->state).feat;
              if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
                return CURLE_OK;
              }
              if (0 < Curl_trc_feat_write.log_level) {
                Curl_trc_write(data,"ignoring duplicate \'chunked\' decoder");
                return CURLE_OK;
              }
              return CURLE_OK;
            }
            return CURLE_OK;
          }
        }
        else {
          bVar17 = false;
LAB_0011d02a:
          if (((local_40 & 1) == 0 && !bVar17) &&
             (pCVar11 = Curl_cwriter_get_by_name(data,"chunked"), pCVar11 != (Curl_cwriter *)0x0)) {
            Curl_failf(data,
                       "Reject response due to \'chunked\' not being the last Transfer-Encoding");
            return CURLE_BAD_CONTENT_ENCODING;
          }
        }
        CVar8 = Curl_cwriter_create(&local_50,data,cwt,bVar16 + 1 + (uint)bVar16);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) && (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write(data,"added %s decoder %s -> %d",pcVar13,cwt->name,(ulong)CVar8);
        }
        if (CVar8 != CURLE_OK) {
          return CVar8;
        }
        CVar8 = Curl_cwriter_add(data,local_50);
        if (CVar8 != CURLE_OK) {
          Curl_cwriter_free(data,local_50);
          return CVar8;
        }
        bVar3 = (bool)(bVar17 | bVar3);
      }
      bVar6 = *pbVar15;
    }
    enclist = (char *)pbVar15;
    if (bVar6 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer ?
    CURL_CW_TRANSFER_DECODE : CURL_CW_CONTENT_DECODE;
  CURLcode result;
  bool has_chunked = FALSE;

  do {
    const char *name;
    size_t namelen;
    bool is_chunked = FALSE;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(*enclist > ' ')
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      CURL_TRC_WRITE(data, "looking for %s decoder: %.*s",
                     is_transfer ? "transfer" : "content", (int)namelen, name);
      is_chunked = (is_transfer && (namelen == 7) &&
                    strncasecompare(name, "chunked", 7));
      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding && !is_chunked) ||
         (!is_transfer && data->set.http_ce_skip)) {
        bool is_identity = strncasecompare(name, "identity", 8);
        /* not requested, ignore */
        CURL_TRC_WRITE(data, "decoder not requested, ignored: %.*s",
                       (int)namelen, name);
        if(is_transfer && !data->set.http_te_skip) {
          if(has_chunked)
            failf(data, "A Transfer-Encoding (%.*s) was listed after chunked",
                  (int)namelen, name);
          else if(is_identity)
            continue;
          else
            failf(data, "Unsolicited Transfer-Encoding (%.*s) found",
                  (int)namelen, name);
          return CURLE_BAD_CONTENT_ENCODING;
        }
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(cwt && is_chunked && Curl_cwriter_get_by_type(data, cwt)) {
        /* A 'chunked' transfer encoding has already been added.
         * Ignore duplicates. See #13451.
         * Also RFC 9112, ch. 6.1:
         * "A sender MUST NOT apply the chunked transfer coding more than
         *  once to a message body."
         */
        CURL_TRC_WRITE(data, "ignoring duplicate 'chunked' decoder");
        return CURLE_OK;
      }

      if(is_transfer && !is_chunked &&
         Curl_cwriter_get_by_name(data, "chunked")) {
        /* RFC 9112, ch. 6.1:
         * "If any transfer coding other than chunked is applied to a
         *  response's content, the sender MUST either apply chunked as the
         *  final transfer coding or terminate the message by closing the
         *  connection."
         * "chunked" must be the last added to be the first in its phase,
         *  reject this.
         */
        failf(data, "Reject response due to 'chunked' not being the last "
              "Transfer-Encoding");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      CURL_TRC_WRITE(data, "added %s decoder %s -> %d",
                     is_transfer ? "transfer" : "content", cwt->name, result);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
      if(is_chunked)
        has_chunked = TRUE;
    }
  } while(*enclist);

  return CURLE_OK;
}